

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O2

void test_socket_close_without_timeout(void)

{
  cio_error cVar1;
  cio_socket s;
  
  read_fake.custom_fake = read_eof;
  cVar1 = cio_socket_init(&s,CIO_ADDRESS_FAMILY_INET4,&loop,0,(cio_socket_close_hook_t)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Return value of cio_socket_init() not correct!",0x19f,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_socket_close(&s);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Return value of close() not correct!",0x1a2,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Socket was not closed correctly!",0x1a4,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)s.impl.ev.fd,(long)close_fake.arg0_val,
             "Socket close was not called with correct parameter!",0x1a5,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)cio_timer_close_fake.call_count,"close timer was not closed!",0x1a6,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)cio_timer_expires_from_now_fake.call_count,
             "Close timer was armed even if close timeout was 0!",0x1a8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)cio_timer_cancel_fake.call_count,
             "Timer cancel called even if close timer was not armed!",0x1a9,UNITY_DISPLAY_STYLE_INT)
  ;
  UnityAssertEqualNumber
            (0,(ulong)shutdown_fake.call_count,"socket shutdown called!",0x1aa,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_socket_close_without_timeout(void)
{
	struct cio_socket s;

	read_fake.custom_fake = read_eof;
	enum cio_error err = cio_socket_init(&s, CIO_ADDRESS_FAMILY_INET4, &loop, 0, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value of cio_socket_init() not correct!");

	err = cio_socket_close(&s);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value of close() not correct!");

	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Socket was not closed correctly!");
	TEST_ASSERT_EQUAL_MESSAGE(s.impl.ev.fd, close_fake.arg0_val, "Socket close was not called with correct parameter!");
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_timer_close_fake.call_count, "close timer was not closed!");

	TEST_ASSERT_EQUAL_MESSAGE(0, cio_timer_expires_from_now_fake.call_count, "Close timer was armed even if close timeout was 0!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_timer_cancel_fake.call_count, "Timer cancel called even if close timer was not armed!");
	TEST_ASSERT_EQUAL_MESSAGE(0, shutdown_fake.call_count, "socket shutdown called!");
}